

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildAsmTypedArr
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,uint32 slotIndex,RegSlot value,
          ViewType viewType)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  ValueType valueType;
  RegSlot srcRegSlot;
  RegOpnd *pRVar4;
  IntConstOpnd *src2Opnd;
  Instr *instr_00;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  IndirOpnd *local_98;
  IndirOpnd *local_90;
  bool local_69;
  RegOpnd *local_60;
  RegOpnd *maskedOpnd;
  RegSlot indexRegSlot;
  uint32 mask;
  IndirOpnd *indirOpnd;
  RegOpnd *regOpnd;
  Instr *maskInstr;
  Instr *instr;
  RegSlot valueRegSlot;
  MemAccessTypeInfo typeInfo;
  OpCode op;
  bool isLd;
  ViewType viewType_local;
  RegSlot value_local;
  uint32 slotIndex_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  local_69 = newOpcode == LdArr || newOpcode == LdArrConst;
  typeInfo.valueRegType._2_1_ = local_69;
  typeInfo.valueRegType._0_2_ = 0x1fe;
  if (newOpcode == LdArr || newOpcode == LdArrConst) {
    typeInfo.valueRegType._0_2_ = 0x1ff;
  }
  typeInfo.valueRegType._3_1_ = viewType;
  typeInfo._4_4_ = value;
  MemAccessTypeInfo::MemAccessTypeInfo((MemAccessTypeInfo *)((long)&instr + 4));
  InitializeMemAccessTypeInfo(typeInfo.valueRegType._3_1_,(MemAccessTypeInfo *)((long)&instr + 4));
  instr._0_4_ = GetRegSlotFromTypedReg(this,typeInfo._4_4_,instr._4_4_);
  if ((newOpcode == LdArr) || (newOpcode == StArr)) {
    uVar1 = *(uint *)(Js::ArrayBufferView::ViewMask + (ulong)(byte)typeInfo.valueRegType._3_1_ * 4);
    srcRegSlot = GetRegSlotFromIntReg(this,slotIndex);
    if (uVar1 == 0xffffffff) {
      local_60 = BuildSrcOpnd(this,srcRegSlot,TyInt32);
    }
    else {
      local_60 = IR::RegOpnd::New(TyUint32,this->m_func);
      pRVar4 = BuildSrcOpnd(this,srcRegSlot,TyInt32);
      src2Opnd = IR::IntConstOpnd::New((ulong)uVar1,TyUint32,this->m_func,false);
      instr_00 = IR::Instr::New(And_I4,&local_60->super_Opnd,&pRVar4->super_Opnd,
                                &src2Opnd->super_Opnd,this->m_func);
      AddInstr(this,instr_00,offset);
    }
    pRVar4 = BuildSrcOpnd(this,4,TyVar);
    _indexRegSlot = IR::IndirOpnd::New(pRVar4,local_60,(IRType)valueRegSlot,this->m_func);
    pRVar4 = IR::IndirOpnd::GetBaseOpnd(_indexRegSlot);
    IR::Opnd::SetValueType(&pRVar4->super_Opnd,(ValueType)valueRegSlot._2_2_);
  }
  else {
    if ((newOpcode != LdArrConst) && (newOpcode != StArrConst)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x663,
                         "(newOpcode == Js::OpCodeAsmJs::LdArrConst || newOpcode == Js::OpCodeAsmJs::StArrConst)"
                         ,
                         "newOpcode == Js::OpCodeAsmJs::LdArrConst || newOpcode == Js::OpCodeAsmJs::StArrConst"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pRVar4 = BuildSrcOpnd(this,4,TyVar);
    _indexRegSlot = IR::IndirOpnd::New(pRVar4,slotIndex,(IRType)valueRegSlot,this->m_func,false);
    pRVar4 = IR::IndirOpnd::GetBaseOpnd(_indexRegSlot);
    IR::Opnd::SetValueType(&pRVar4->super_Opnd,(ValueType)valueRegSlot._2_2_);
  }
  if ((instr._4_4_ == FLOAT32) || (instr._4_4_ == FLOAT64)) {
    bVar3 = IRType_IsFloat((IRType)valueRegSlot);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x66b,"(IRType_IsFloat(typeInfo.type))","IRType_IsFloat(typeInfo.type)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((typeInfo.valueRegType._2_1_ & 1) == INT32 >> 0x10) {
      local_90 = (IndirOpnd *)BuildSrcOpnd(this,(RegSlot)instr,(IRType)valueRegSlot);
    }
    else {
      local_90 = (IndirOpnd *)BuildDstOpnd(this,(RegSlot)instr,(IRType)valueRegSlot);
    }
    indirOpnd = local_90;
    IR::Opnd::SetValueType(&local_90->super_Opnd,ValueType::Float);
  }
  else {
    bVar3 = IRType_IsNativeInt((IRType)valueRegSlot);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x671,"(IRType_IsNativeInt(typeInfo.type))",
                         "IRType_IsNativeInt(typeInfo.type)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if (instr._4_4_ != INT32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x672,"(typeInfo.valueRegType == WAsmJs::INT32)",
                         "typeInfo.valueRegType == WAsmJs::INT32");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    if ((typeInfo.valueRegType._2_1_ & 1) == INT32 >> 0x10) {
      local_98 = (IndirOpnd *)BuildSrcOpnd(this,(RegSlot)instr,TyInt32);
    }
    else {
      local_98 = (IndirOpnd *)BuildDstOpnd(this,(RegSlot)instr,TyInt32);
    }
    indirOpnd = local_98;
    valueType = ValueType::GetInt(false);
    IR::Opnd::SetValueType(&local_98->super_Opnd,valueType);
  }
  if ((typeInfo.valueRegType._2_1_ & 1) == INT32 >> 0x10) {
    maskInstr = IR::Instr::New((undefined2)typeInfo.valueRegType,&_indexRegSlot->super_Opnd,
                               &indirOpnd->super_Opnd,this->m_func);
  }
  else {
    maskInstr = IR::Instr::New((undefined2)typeInfo.valueRegType,&indirOpnd->super_Opnd,
                               &_indexRegSlot->super_Opnd,this->m_func);
  }
  this_00 = Func::GetJITFunctionBody(this->m_func);
  bVar3 = JITTimeFunctionBody::UsesWAsmJsFastVirtualBuffer(this_00);
  if (!bVar3) {
    pRVar4 = BuildSrcOpnd(this,5,TyUint32);
    IR::Instr::SetSrc2(maskInstr,&pRVar4->super_Opnd);
  }
  AddInstr(this,maskInstr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildAsmTypedArr(Js::OpCodeAsmJs newOpcode, uint32 offset, uint32 slotIndex, Js::RegSlot value, Js::ArrayBufferView::ViewType viewType)
{
    bool isLd = newOpcode == Js::OpCodeAsmJs::LdArr || newOpcode == Js::OpCodeAsmJs::LdArrConst;
    Js::OpCode op = isLd ? Js::OpCode::LdArrViewElem : Js::OpCode::StArrViewElem;

    MemAccessTypeInfo typeInfo;
    InitializeMemAccessTypeInfo(viewType, &typeInfo);

    Js::RegSlot valueRegSlot = GetRegSlotFromTypedReg(value, typeInfo.valueRegType);
    IR::Instr * instr = nullptr;
    IR::Instr * maskInstr = nullptr;
    IR::RegOpnd * regOpnd = nullptr;
    IR::IndirOpnd * indirOpnd = nullptr;

    // Get the index
    if (newOpcode == Js::OpCodeAsmJs::LdArr || newOpcode == Js::OpCodeAsmJs::StArr)
    {
        uint32 mask = Js::ArrayBufferView::ViewMask[viewType];
        Js::RegSlot indexRegSlot = GetRegSlotFromIntReg(slotIndex);
        IR::RegOpnd * maskedOpnd = nullptr;
        if (mask != ~0)
        {
            maskedOpnd = IR::RegOpnd::New(TyUint32, m_func);
            maskInstr = IR::Instr::New(Js::OpCode::And_I4, maskedOpnd, BuildSrcOpnd(indexRegSlot, TyInt32), IR::IntConstOpnd::New(mask, TyUint32, m_func), m_func);
            AddInstr(maskInstr, offset);
        }
        else
        {
            maskedOpnd = BuildSrcOpnd(indexRegSlot, TyInt32);
        }
        indirOpnd = IR::IndirOpnd::New(BuildSrcOpnd(AsmJsRegSlots::BufferReg, TyVar), maskedOpnd, typeInfo.type, m_func);
        indirOpnd->GetBaseOpnd()->SetValueType(typeInfo.arrayType);
    }
    else
    {
        Assert(newOpcode == Js::OpCodeAsmJs::LdArrConst || newOpcode == Js::OpCodeAsmJs::StArrConst);
        indirOpnd = IR::IndirOpnd::New(BuildSrcOpnd(AsmJsRegSlots::BufferReg, TyVar), slotIndex, typeInfo.type, m_func);
        indirOpnd->GetBaseOpnd()->SetValueType(typeInfo.arrayType);
    }

    // Setup the value/destination
    if (typeInfo.valueRegType == WAsmJs::FLOAT32 || typeInfo.valueRegType == WAsmJs::FLOAT64)
    {
        Assert(IRType_IsFloat(typeInfo.type));
        regOpnd = !isLd ? BuildSrcOpnd(valueRegSlot, typeInfo.type) : BuildDstOpnd(valueRegSlot, typeInfo.type);
        regOpnd->SetValueType(ValueType::Float);
    }
    else
    {
        Assert(IRType_IsNativeInt(typeInfo.type));
        Assert(typeInfo.valueRegType == WAsmJs::INT32);
        regOpnd = !isLd ? BuildSrcOpnd(valueRegSlot, TyInt32) : BuildDstOpnd(valueRegSlot, TyInt32);
        regOpnd->SetValueType(ValueType::GetInt(false));
    }

    // Create the instruction
    if (isLd)
    {
        instr = IR::Instr::New(op, regOpnd, indirOpnd, m_func);
    }
    else
    {
        instr = IR::Instr::New(op, indirOpnd, regOpnd, m_func);
    }

    if (!m_func->GetJITFunctionBody()->UsesWAsmJsFastVirtualBuffer())
    {
        instr->SetSrc2(BuildSrcOpnd(AsmJsRegSlots::LengthReg, TyUint32));
    }
    AddInstr(instr, offset);
}